

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O2

void __thiscall
AwsCommandRunner_PreviousCommandFailed_Test::TestBody
          (AwsCommandRunner_PreviousCommandFailed_Test *this)

{
  bool bVar1;
  MockSpec<bool_()> *this_00;
  TypedExpectation<bool_()> *pTVar2;
  char *in_R9;
  AssertHelper AStack_288;
  allocator local_279;
  string local_278;
  AssertionResult gtest_ar_;
  undefined1 local_238 [8];
  linked_ptr_internal lStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Base_ptr local_218;
  size_t local_210;
  AwsCommandRunner aws_command_runner;
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  
  anon_unknown.dwarf_103e0::MockCommandRunner::MockCommandRunner(&command_runner);
  MultipleCommandRunner::MultipleCommandRunner
            (&multiple_command_runner,&command_runner.super_CommandRunner);
  this_00 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_PreviousCommandFailed
                      (&command_runner);
  pTVar2 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (this_00,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x2b,"command_runner","PreviousCommandFailed()");
  pTVar2 = testing::internal::TypedExpectation<bool_()>::Times(pTVar2,2);
  local_238 = (undefined1  [8])operator_new(1);
  *(bool *)local_238 = false;
  lStack_230.next_ = &lStack_230;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&aws_command_runner);
  pTVar2 = testing::internal::TypedExpectation<bool_()>::WillOnce
                     (pTVar2,(Action<bool_()> *)&aws_command_runner);
  local_278._M_dataplus._M_p = (pointer)operator_new(1);
  *local_278._M_dataplus._M_p = '\x01';
  local_278._M_string_length = (size_type)&local_278._M_string_length;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&gtest_ar_);
  testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar2,(Action<bool_()> *)&gtest_ar_);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&gtest_ar_);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)&local_278);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&aws_command_runner);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)local_238);
  std::__cxx11::string::string((string *)&gtest_ar_,"/tmp/",(allocator *)&AStack_288);
  std::__cxx11::string::string((string *)&local_278,"unused",&local_279);
  local_238 = (undefined1  [8])0x0;
  lStack_230.next_ = (linked_ptr_internal *)0x0;
  local_228._M_allocated_capacity = 0;
  local_210 = 0;
  local_228._8_8_ = (_Base_ptr)&lStack_230;
  local_218 = (_Base_ptr)&lStack_230;
  AwsCommandRunner::AwsCommandRunner
            (&aws_command_runner,&multiple_command_runner,(string *)&gtest_ar_,&local_278,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_238);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  bVar1 = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_238,(internal *)&gtest_ar_,
               (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x32,(char *)local_238);
    testing::internal::AssertHelper::operator=(&AStack_288,(Message *)&local_278);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ = AwsCommandRunner::PreviousCommandFailed(&aws_command_runner);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) goto LAB_00158f93;
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_238,(internal *)&gtest_ar_,
               (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x33,(char *)local_238);
    testing::internal::AssertHelper::operator=(&AStack_288,(Message *)&local_278);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_288);
  std::__cxx11::string::~string((string *)local_238);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_278);
LAB_00158f93:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  AwsCommandRunner::~AwsCommandRunner(&aws_command_runner);
  std::
  deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
  ::~deque(&multiple_command_runner.enqueued_commands_.c);
  anon_unknown.dwarf_103e0::MockCommandRunner::~MockCommandRunner(&command_runner);
  return;
}

Assistant:

TEST(AwsCommandRunner, PreviousCommandFailed) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .Times(2)
      .WillOnce(Return(false))
      .WillOnce(Return(true));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "unused", {});
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_TRUE(aws_command_runner.PreviousCommandFailed());
}